

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O1

bool goodform::convert<int>(any *v,int *dest)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  short *psVar5;
  unsigned_long *puVar6;
  byte *pbVar7;
  unsigned_short *puVar8;
  float *pfVar9;
  double *pdVar10;
  
  bVar1 = can_be<int>(v);
  if (!bVar1) {
    return bVar1;
  }
  bVar2 = is<signed_char>(v);
  if (bVar2) {
    pcVar4 = get<signed_char>(v);
    uVar3 = (uint)*pcVar4;
  }
  else {
    bVar2 = is<short>(v);
    if (bVar2) {
      psVar5 = get<short>(v);
      uVar3 = (uint)*psVar5;
    }
    else {
      bVar2 = is<int>(v);
      if (bVar2) {
        puVar6 = (unsigned_long *)get<int>(v);
      }
      else {
        bVar2 = is<long>(v);
        if (bVar2) {
          puVar6 = (unsigned_long *)get<long>(v);
        }
        else {
          bVar2 = is<unsigned_char>(v);
          if (bVar2) {
            pbVar7 = get<unsigned_char>(v);
            uVar3 = (uint)*pbVar7;
            goto LAB_001298c4;
          }
          bVar2 = is<unsigned_short>(v);
          if (bVar2) {
            puVar8 = get<unsigned_short>(v);
            uVar3 = (uint)*puVar8;
            goto LAB_001298c4;
          }
          bVar2 = is<unsigned_int>(v);
          if (bVar2) {
            puVar6 = (unsigned_long *)get<unsigned_int>(v);
          }
          else {
            bVar2 = is<unsigned_long>(v);
            if (!bVar2) {
              bVar2 = is<float>(v);
              if (bVar2) {
                pfVar9 = get<float>(v);
                uVar3 = (uint)*pfVar9;
              }
              else {
                bVar2 = is<double>(v);
                if (!bVar2) {
                  return bVar1;
                }
                pdVar10 = get<double>(v);
                uVar3 = (uint)*pdVar10;
              }
              goto LAB_001298c4;
            }
            puVar6 = get<unsigned_long>(v);
          }
        }
      }
      uVar3 = (uint)*puVar6;
    }
  }
LAB_001298c4:
  *dest = uVar3;
  return bVar1;
}

Assistant:

bool convert(const any& v, T& dest)
  {
    if (can_be<T>(v))
    {
      if (is<std::int8_t>(v))        dest = T(get<std::int8_t>(v));
      else if (is<std::int16_t>(v))  dest = T(get<std::int16_t>(v));
      else if (is<std::int32_t>(v))  dest = T(get<std::int32_t>(v));
      else if (is<std::int64_t>(v))  dest = T(get<std::int64_t>(v));
      else if (is<std::uint8_t>(v))  dest = T(get<std::uint8_t>(v));
      else if (is<std::uint16_t>(v)) dest = T(get<std::uint16_t>(v));
      else if (is<std::uint32_t>(v)) dest = T(get<std::uint32_t>(v));
      else if (is<std::uint64_t>(v)) dest = T(get<std::uint64_t>(v));
      else if (is<float>(v))         dest = T(get<float>(v));
      else if (is<double>(v))        dest = T(get<double>(v));
      return true;
    }
    return false;
  }